

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choice.c
# Opt level: O3

void choice_print(t_choice *x)

{
  t_elem_conflict *ptVar1;
  long lVar2;
  ulong uVar3;
  
  if (0 < x->x_n) {
    lVar2 = 0x28;
    uVar3 = 0;
    do {
      ptVar1 = x->x_vec;
      post("%2d age %2d w %5.2f %5.2f %5.2f %5.2f %5.2f %5.2f %5.2f %5.2f %5.2f %5.2f",
           (double)*(float *)((long)ptVar1->e_weight + lVar2 + -0x28),
           (double)*(float *)((long)ptVar1->e_weight + lVar2 + -0x24),
           (double)*(float *)((long)ptVar1->e_weight + lVar2 + -0x20),
           (double)*(float *)((long)ptVar1->e_weight + lVar2 + -0x1c),
           (double)*(float *)((long)ptVar1->e_weight + lVar2 + -0x18),
           (double)*(float *)((long)ptVar1->e_weight + lVar2 + -0x14),
           (double)*(float *)((long)ptVar1->e_weight + lVar2 + -0x10),
           (double)*(float *)((long)ptVar1->e_weight + lVar2 + -0xc),uVar3 & 0xffffffff,
           (ulong)(uint)(int)*(float *)((long)ptVar1->e_weight + lVar2 + -0x2c));
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x2c;
    } while ((long)uVar3 < (long)x->x_n);
  }
  return;
}

Assistant:

static void choice_print(t_choice *x)
{
    int j;
    for (j = 0; j < x->x_n; j++)
    {
        t_elem *e = x->x_vec + j;
        t_float *w = e->e_weight;
        post("%2d age %2d \
w %5.2f %5.2f %5.2f %5.2f %5.2f %5.2f %5.2f %5.2f %5.2f %5.2f",
            j, (int)(e->e_age), w[0], w[1], w[2], w[3], w[4], w[5],
                w[6], w[7], w[8], w[9]);
    }
}